

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfAdjointEigenSolver.h
# Opt level: O0

void __thiscall
Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::SelfAdjointEigenSolver
          (SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,Index size)

{
  long local_60;
  long local_30 [3];
  Index local_18;
  Index size_local;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  local_18 = size;
  size_local = (Index)this;
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_18,&local_18);
  Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_eivalues,&local_18);
  if (local_18 < 2) {
    local_60 = 1;
  }
  else {
    local_60 = local_18 + -1;
  }
  local_30[0] = local_60;
  Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_subdiag,local_30);
  this->m_isInitialized = false;
  return;
}

Assistant:

SelfAdjointEigenSolver(Index size)
        : m_eivec(size, size),
          m_eivalues(size),
          m_subdiag(size > 1 ? size - 1 : 1),
          m_isInitialized(false)
    {}